

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_things.cpp
# Opt level: O0

void swrenderer::R_AddSprites(sector_t_conflict *sec,int lightlevel,int fakeside)

{
  F3DFloor *pFVar1;
  bool bVar2;
  int iVar3;
  MetaClass *pMVar4;
  TArray<F3DFloor_*,_F3DFloor_*> *this;
  F3DFloor **ppFVar5;
  double dVar6;
  double dVar7;
  F3DFloor *rover;
  iterator __end2;
  iterator __begin2;
  TDeletingArray<F3DFloor_*,_F3DFloor_*> *__range2;
  double check;
  TVector3<double> local_60;
  double local_48;
  double dist;
  FIntCVar *cvar;
  AActor *thing;
  msecnode_t *p;
  F3DFloor *fakefloor;
  F3DFloor *fakeceiling;
  int fakeside_local;
  int lightlevel_local;
  sector_t_conflict *sec_local;
  
  fakefloor = (F3DFloor *)0x0;
  p = (msecnode_t *)0x0;
  if ((sec->touching_renderthings != (msecnode_t *)0x0) && (sec->validcount != validcount)) {
    sec->validcount = validcount;
    spriteshade = (lightlevel + r_actualextralight + 0xc) * -0x4000 + 0x400000;
    fakeceiling._0_4_ = fakeside;
    fakeceiling._4_4_ = lightlevel;
    _fakeside_local = sec;
    for (thing = (AActor *)sec->touching_renderthings; thing != (AActor *)0x0;
        thing = (AActor *)(thing->super_DThinker).NextThinker) {
      cvar = (FIntCVar *)(thing->super_DThinker).super_DObject.Class;
      if (((AActor *)cvar)->validcount != validcount) {
        ((AActor *)cvar)->validcount = validcount;
        pMVar4 = AActor::GetClass((AActor *)cvar);
        dist = (double)pMVar4->distancecheck;
        if (((FIntCVar *)dist != (FIntCVar *)0x0) &&
           (iVar3 = FIntCVar::operator_cast_to_int((FIntCVar *)dist), -1 < iVar3)) {
          AActor::Pos((DVector3 *)&check,(AActor *)cvar);
          TVector3<double>::operator-(&local_60,(TVector3<double> *)&check,&ViewPos);
          local_48 = TVector3<double>::LengthSquared(&local_60);
          iVar3 = FIntCVar::operator*((FIntCVar *)dist);
          if ((double)iVar3 * (double)iVar3 <= local_48) goto LAB_0038ccb5;
        }
        this = (TArray<F3DFloor_*,_F3DFloor_*> *)
               (*(long *)(*(long *)&cvar[6].super_FBaseCVar.Flags + 0x210) + 0x70);
        __end2 = TArray<F3DFloor_*,_F3DFloor_*>::begin(this);
        rover = (F3DFloor *)TArray<F3DFloor_*,_F3DFloor_*>::end(this);
        while (bVar2 = TIterator<F3DFloor_*>::operator!=(&__end2,(TIterator<F3DFloor_*> *)&rover),
              bVar2) {
          ppFVar5 = TIterator<F3DFloor_*>::operator*(&__end2);
          pFVar1 = *ppFVar5;
          if (((((pFVar1->flags & 1) != 0) && ((pFVar1->flags & 8) != 0)) &&
              ((pFVar1->flags & 2) != 0)) && (pFVar1->alpha == 0xff)) {
            if ((p == (msecnode_t *)0x0) &&
               (bVar2 = secplane_t::isSlope((pFVar1->top).plane), !bVar2)) {
              dVar6 = secplane_t::ZatPoint((pFVar1->top).plane,0.0,0.0);
              dVar7 = AActor::Z((AActor *)cvar);
              if (dVar6 <= dVar7) {
                p = (msecnode_t *)pFVar1;
              }
            }
            bVar2 = secplane_t::isSlope((pFVar1->bottom).plane);
            if (!bVar2) {
              dVar6 = secplane_t::ZatPoint((pFVar1->bottom).plane,0.0,0.0);
              dVar7 = AActor::Top((AActor *)cvar);
              if (dVar7 <= dVar6) {
                fakefloor = pFVar1;
              }
            }
          }
          TIterator<F3DFloor_*>::operator++(&__end2);
        }
        R_ProjectSprite((AActor *)cvar,(int)fakeceiling,(F3DFloor *)p,fakefloor,_fakeside_local);
        fakefloor = (F3DFloor *)0x0;
        p = (msecnode_t *)0x0;
      }
LAB_0038ccb5:
    }
  }
  return;
}

Assistant:

void R_AddSprites (sector_t *sec, int lightlevel, int fakeside)
{
	F3DFloor *fakeceiling = NULL;
	F3DFloor *fakefloor = NULL;

	// BSP is traversed by subsector.
	// A sector might have been split into several
	//	subsectors during BSP building.
	// Thus we check whether it was already added.
	if (sec->touching_renderthings == nullptr || sec->validcount == validcount)
		return;

	// Well, now it will be done.
	sec->validcount = validcount;

	spriteshade = LIGHT2SHADE(lightlevel + r_actualextralight);

	// Handle all things in sector.
	for(auto p = sec->touching_renderthings; p != nullptr; p = p->m_snext)
	{
		auto thing = p->m_thing;
		if (thing->validcount == validcount) continue;
		thing->validcount = validcount;
		
		FIntCVar *cvar = thing->GetClass()->distancecheck;
		if (cvar != NULL && *cvar >= 0)
		{
			double dist = (thing->Pos() - ViewPos).LengthSquared();
			double check = (double)**cvar;
			if (dist >= check * check)
			{
				continue;
			}
		}

		// find fake level
		for(auto rover : thing->Sector->e->XFloor.ffloors) 
		{
			if(!(rover->flags & FF_EXISTS) || !(rover->flags & FF_RENDERPLANES)) continue;
			if(!(rover->flags & FF_SOLID) || rover->alpha != 255) continue;
			if(!fakefloor)
			{
				if(!rover->top.plane->isSlope())
				{
					if(rover->top.plane->ZatPoint(0., 0.) <= thing->Z()) fakefloor = rover;
				}
			}
			if(!rover->bottom.plane->isSlope())
			{
				if(rover->bottom.plane->ZatPoint(0., 0.) >= thing->Top()) fakeceiling = rover;
			}
		}	
		R_ProjectSprite (thing, fakeside, fakefloor, fakeceiling, sec);
		fakeceiling = NULL;
		fakefloor = NULL;
	}
}